

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

Vec3fa __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
::computeDirection(CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
                   *this,uint primID,size_t time)

{
  float *pfVar1;
  float fVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  long in_RCX;
  undefined4 in_register_00000034;
  Vec3fa *axis1;
  Vec3fa VVar9;
  
  lVar5 = *(long *)(CONCAT44(in_register_00000034,primID) + 0x188);
  uVar4 = *(uint *)(*(long *)(CONCAT44(in_register_00000034,primID) + 0x58) +
                   (time & 0xffffffff) * *(long *)(CONCAT44(in_register_00000034,primID) + 0x68));
  lVar6 = *(long *)(lVar5 + in_RCX * 0x38);
  lVar5 = *(long *)(lVar5 + 0x10 + in_RCX * 0x38);
  auVar3 = *(undefined1 (*) [16])(lVar6 + (ulong)uVar4 * lVar5);
  pfVar1 = (float *)(lVar6 + (ulong)(uVar4 + 3) * lVar5);
  fVar7 = pfVar1[2];
  fVar8 = pfVar1[3];
  fVar2 = *(float *)(CONCAT44(in_register_00000034,primID) + 0x24c);
  VVar9.field_0._0_8_ = auVar3._0_8_;
  VVar9.field_0._8_4_ = *pfVar1 - auVar3._0_4_;
  VVar9.field_0._12_4_ = pfVar1[1] - auVar3._4_4_;
  *(float *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
             super_Geometry.super_RefCount._vptr_RefCount = VVar9.field_0._8_4_;
  *(float *)((long)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                    super_Geometry.super_RefCount._vptr_RefCount + 4) = VVar9.field_0._12_4_;
  *(float *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
             super_Geometry.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       fVar7 - auVar3._8_4_;
  *(float *)((long)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                    super_Geometry.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
            + 4) = fVar8 * fVar2 - auVar3._12_4_ * fVar2;
  return (Vec3fa)VVar9.field_0;
}

Assistant:

Vec3fa computeDirection(unsigned int primID, size_t time) const
      {
        const Curve3ff c = getCurveScaledRadius(primID,time);
        const Vec3fa p0 = c.begin();
        const Vec3fa p3 = c.end();
        const Vec3fa axis1 = p3 - p0;
        return axis1;
      }